

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::SyncCollisionModels(ChBody *this)

{
  int iVar1;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  iVar1 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[10])();
  if ((char)iVar1 != '\0') {
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,
               &(this->collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (*(local_20._M_ptr)->_vptr_ChCollisionModel[0x18])();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  return;
}

Assistant:

void ChBody::SyncCollisionModels() {
    if (this->GetCollide())
        this->GetCollisionModel()->SyncPosition();
}